

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

void __thiscall QWidgetPrivate::setParent_sys(QWidgetPrivate *this,QWidget *newparent,WindowFlags f)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  QWidget *this_00;
  QWExtra *pQVar4;
  long lVar5;
  long lVar6;
  WindowFlags WVar7;
  bool on;
  QScreen *ptr;
  QWidget *pQVar8;
  QWindow *pQVar9;
  QDebug *pQVar10;
  QTLWExtra *pQVar11;
  long lVar12;
  long in_FS_OFFSET;
  bool bVar13;
  QDebug local_58;
  QDebug local_50;
  QDebug local_48;
  WindowFlags f_local;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&this->field_0x8;
  uVar1 = (this->data).window_flags.super_QFlagsStorageHelper<Qt::WindowType,_4>.
          super_QFlagsStorage<Qt::WindowType>.i;
  uVar2 = *(uint *)(*(long *)&this_00->field_0x8 + 0x240);
  f_local.super_QFlagsStorageHelper<Qt::WindowType,_4>.super_QFlagsStorage<Qt::WindowType>.i =
       f.super_QFlagsStorageHelper<Qt::WindowType,_4>.super_QFlagsStorage<Qt::WindowType>.i;
  if (newparent == (QWidget *)0x0) {
    ptr = (QScreen *)0x0;
  }
  else {
    if ((char)(newparent->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
              super_QFlagsStorage<Qt::WindowType>.i != '\x11') {
      ptr = (QScreen *)0x0;
      goto LAB_00300c01;
    }
    ptr = QWidget::screen(newparent);
  }
  newparent = (QWidget *)0x0;
LAB_00300c01:
  setWinId(this,0);
  if ((newparent == (QWidget *)0x0) &&
     (f.super_QFlagsStorageHelper<Qt::WindowType,_4>.super_QFlagsStorage<Qt::WindowType>.i =
           (QFlagsStorageHelper<Qt::WindowType,_4>)
           ((uint)f.super_QFlagsStorageHelper<Qt::WindowType,_4>.super_QFlagsStorage<Qt::WindowType>
                  .i | 1),
     f_local.super_QFlagsStorageHelper<Qt::WindowType,_4>.super_QFlagsStorage<Qt::WindowType>.i =
          f.super_QFlagsStorageHelper<Qt::WindowType,_4>.super_QFlagsStorage<Qt::WindowType>.i,
     *(long *)&this->field_0x10 != 0)) {
    pQVar8 = QWidget::window(*(QWidget **)(*(long *)&this_00->field_0x8 + 0x10));
    ptr = QWidget::screen(pQVar8);
  }
  if (((uVar1 & 1) == 0) ||
     (((uint)f.super_QFlagsStorageHelper<Qt::WindowType,_4>.super_QFlagsStorage<Qt::WindowType>.i &
      1) != 0 || (uVar2 >> 0x1c & 1) == 0)) {
    bVar13 = false;
  }
  else {
    bVar13 = (*(byte *)(*(long *)&this_00->field_0x8 + 0x248) & 0x10) == 0;
  }
  if (*(QWidget **)&this->field_0x10 != newparent) {
    QObjectPrivate::setParent_helper((QObject *)this);
    pQVar9 = QWidget::windowHandle(this_00);
    if (pQVar9 != (QWindow *)0x0) {
      QWindow::setFlags(pQVar9,f.super_QFlagsStorageHelper<Qt::WindowType,_4>.
                               super_QFlagsStorage<Qt::WindowType>.i);
    }
    pQVar8 = closestParentWidgetWithWindowHandle(this);
    if (bVar13) {
      reparentWidgetWindowChildren(this,pQVar8);
    }
    else {
      reparentWidgetWindows(this,pQVar8,f);
    }
  }
  on = isExplicitlyHidden(this);
  if (bVar13) {
    pQVar4 = (this->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
             super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
             super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
    if ((pQVar4 != (QWExtra *)0x0) && ((pQVar4->field_0x7d & 1) != 0)) {
      QWindowContainer::toplevelAboutToBeDestroyed(this_00);
    }
    pQVar9 = QWidget::windowHandle(this_00);
    lVar5 = *(long *)(pQVar9 + 8);
    lVar6 = *(long *)(lVar5 + 0x28);
    if (lVar6 != 0) {
      pQVar8 = closestParentWidgetWithWindowHandle(this);
      if (pQVar8 != (QWidget *)0x0) {
        QWidget::windowHandle(pQVar8);
      }
      lVar5 = *(long *)(lVar5 + 0x20);
      for (lVar12 = 0; lVar6 << 3 != lVar12; lVar12 = lVar12 + 8) {
        pQVar9 = *(QWindow **)(lVar5 + lVar12);
        if ((pQVar9 != (QWindow *)0x0) && ((*(byte *)(*(long *)(pQVar9 + 8) + 0x30) & 0x40) != 0)) {
          lcWidgetWindow();
          if (((byte)lcWidgetWindow::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1
              ) != 0) {
            QMessageLogger::warning();
            pQVar10 = QDebug::operator<<(&local_58,"Reparenting");
            local_50.stream = pQVar10->stream;
            *(int *)(local_50.stream + 0x28) = *(int *)(local_50.stream + 0x28) + 1;
            ::operator<<((Stream *)&local_48,(QWindow *)&local_50);
            pQVar10 = QDebug::operator<<(&local_48,"before destroying");
            QDebug::operator<<(pQVar10,this);
            QDebug::~QDebug(&local_48);
            QDebug::~QDebug(&local_50);
            QDebug::~QDebug(&local_58);
          }
          QWindow::setParent(pQVar9);
        }
      }
    }
    QWidget::destroy(this_00,true,false);
  }
  adjustFlags(&f_local,this_00);
  WVar7 = f_local;
  (this->data).window_flags.super_QFlagsStorageHelper<Qt::WindowType,_4>.
  super_QFlagsStorage<Qt::WindowType>.i =
       (Int)f_local.super_QFlagsStorageHelper<Qt::WindowType,_4>.super_QFlagsStorage<Qt::WindowType>
            .i;
  QWidget::setAttribute(this_00,WA_WState_Created,false);
  QWidget::setAttribute(this_00,WA_WState_Visible,false);
  QWidget::setAttribute(this_00,WA_WState_Hidden,false);
  if (((uVar2 >> 0x1c & 1) != 0 && newparent != (QWidget *)0x0) &&
     (((uint)WVar7.super_QFlagsStorageHelper<Qt::WindowType,_4>.super_QFlagsStorage<Qt::WindowType>.
             i & 1) != 0 || (*(uint *)(*(long *)&this_00->field_0x8 + 0x248) & 0x10) != 0)) {
    QWidget::createWinId(this_00);
  }
  if (((newparent == (QWidget *)0x0) ||
      (((this_00->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
        super_QFlagsStorage<Qt::WindowType>.i & 1) != 0)) ||
     ((~on & (newparent->data->widget_attributes & 0x8000) == 0) == 0)) {
    QWidget::setAttribute(this_00,WA_WState_Hidden,true);
  }
  QWidget::setAttribute(this_00,WA_WState_ExplicitShowHide,on);
  if ((newparent == (QWidget *)0x0) && (ptr != (QScreen *)0x0)) {
    if ((*(byte *)(*(long *)&this_00->field_0x8 + 0x243) & 0x10) == 0) {
      pQVar11 = topData(this);
      QWeakPointer<QObject>::assign<QObject>(&(pQVar11->initialScreen).wp,(QObject *)ptr);
    }
    else {
      pQVar9 = QWidget::windowHandle(this_00);
      QWindow::setScreen((QScreen *)pQVar9);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetPrivate::setParent_sys(QWidget *newparent, Qt::WindowFlags f)
{
    Q_Q(QWidget);

    Qt::WindowFlags oldFlags = data.window_flags;
    bool wasCreated = q->testAttribute(Qt::WA_WState_Created);

    QScreen *targetScreen = nullptr;
    // Handle a request to move the widget to a particular screen
    if (newparent && newparent->windowType() == Qt::Desktop) {
        // make sure the widget is created on the same screen as the
        // programmer specified desktop widget
        targetScreen = newparent->screen();
        newparent = nullptr;
    }

    setWinId(0);

    if (!newparent) {
        f |= Qt::Window;
        if (parent)
            targetScreen = q->parentWidget()->window()->screen();
    }

    const bool destroyWindow = (
        // Reparenting top level to child
        (oldFlags & Qt::Window) && !(f & Qt::Window)
        // And we can dispose of the window
        && wasCreated && !q->testAttribute(Qt::WA_NativeWindow)
    );

    if (parent != newparent) {
        // Update object parent now, so we can resolve new parent window below
        QObjectPrivate::setParent_helper(newparent);

        if (q->windowHandle())
            q->windowHandle()->setFlags(f);

        // If the widget itself or any of its children have been created,
        // we need to reparent their QWindows as well.
        QWidget *parentWithWindow = closestParentWidgetWithWindowHandle();
        // But if the widget is about to be destroyed we must skip the
        // widget itself, and only reparent children.
        if (destroyWindow) {
            reparentWidgetWindowChildren(parentWithWindow);
        } else {
            // During reparentWidgetWindows() we need to know whether the reparented
            // QWindow should be a top level (with a transient parent) or not. This
            // widget has not updated its window flags yet, so we can't ask the widget
            // directly at that point. Nor can we use the QWindow flags, as unlike QWidgets
            // the QWindow flags always reflect Qt::Window, even for child windows. And
            // we can't use QWindow::isTopLevel() either, as that depends on the parent,
            // which we are in the process of updating. So we propagate the
            // new flags of the reparented window here.
            reparentWidgetWindows(parentWithWindow, f);
        }
    }

    bool explicitlyHidden = isExplicitlyHidden();

    if (destroyWindow) {
        if (extra && extra->hasWindowContainer)
            QWindowContainer::toplevelAboutToBeDestroyed(q);

        // There shouldn't be any QWindow children left, but if there
        // are, re-parent them now, before we destroy.
        if (!q->windowHandle()->children().isEmpty()) {
            QWidget *parentWithWindow = closestParentWidgetWithWindowHandle();
            QWindow *newParentWindow = parentWithWindow ? parentWithWindow->windowHandle() : nullptr;
            for (QObject *child : q->windowHandle()->children()) {
                if (QWindow *childWindow = qobject_cast<QWindow *>(child)) {
                    qCWarning(lcWidgetWindow) << "Reparenting" << childWindow
                                              << "before destroying" << this;
                    childWindow->setParent(newParentWindow);
                }
            }
        }

        // We have reparented any child windows of the widget we are
        // about to destroy to the new parent window handle, so we can
        // safely destroy this widget without destroying sub windows.
        q->destroy(true, false);
    }

    adjustFlags(f, q);
    data.window_flags = f;
    q->setAttribute(Qt::WA_WState_Created, false);
    q->setAttribute(Qt::WA_WState_Visible, false);
    q->setAttribute(Qt::WA_WState_Hidden, false);

    if (newparent && wasCreated && (q->testAttribute(Qt::WA_NativeWindow) || (f & Qt::Window)))
        q->createWinId();

    if (q->isWindow() || (!newparent || newparent->isVisible()) || explicitlyHidden)
        q->setAttribute(Qt::WA_WState_Hidden);
    q->setAttribute(Qt::WA_WState_ExplicitShowHide, explicitlyHidden);

    // move the window to the selected screen
    if (!newparent && targetScreen) {
        // only if it is already created
        if (q->testAttribute(Qt::WA_WState_Created))
            q->windowHandle()->setScreen(targetScreen);
        else
            topData()->initialScreen = targetScreen;
    }
}